

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O1

char * match(MatchState *ms,char *s,char *p)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ulong uVar6;
  ptrdiff_t *ppVar7;
  byte *s_00;
  byte *pbVar8;
  bool bVar9;
  char *local_48;
  
  do {
    while (bVar1 = *p, bVar1 == 0x25) {
      bVar1 = ((byte *)p)[1];
      if (bVar1 == 0x66) {
        if (((byte *)p)[2] != 0x5b) {
          luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
        }
        pbVar8 = (byte *)p + 2;
        p = classend(ms,(char *)pbVar8);
        if (s == ms->src_init) {
          uVar4 = 0;
        }
        else {
          uVar4 = (uint)((byte *)s)[-1];
        }
        iVar3 = matchbracketclass(uVar4,(char *)pbVar8,(char *)((byte *)p + -1));
        bVar9 = true;
        if ((iVar3 == 0) &&
           (iVar3 = matchbracketclass((uint)(byte)*s,(char *)pbVar8,(char *)((byte *)p + -1)),
           iVar3 != 0)) {
          bVar9 = false;
        }
        else {
          local_48 = (char *)0x0;
          p = (char *)pbVar8;
        }
        if (bVar9) {
          return local_48;
        }
      }
      else if (bVar1 == 0x62) {
        if ((((byte *)p)[2] == 0) || (((byte *)p)[3] == 0)) {
          luaL_error(ms->L,"unbalanced pattern");
        }
        if (*s == ((byte *)p)[2]) {
          pbVar8 = (byte *)s + 1;
          if (pbVar8 < ms->src_end) {
            iVar3 = 1;
            do {
              if (*pbVar8 == ((byte *)p)[3]) {
                iVar3 = iVar3 + -1;
                if (iVar3 == 0) {
                  s = (char *)(pbVar8 + 1);
                  goto LAB_00113959;
                }
              }
              else {
                iVar3 = iVar3 + (uint)(*pbVar8 == ((byte *)p)[2]);
              }
              pbVar8 = pbVar8 + 1;
            } while (pbVar8 != (byte *)ms->src_end);
          }
        }
        s = (char *)0x0;
LAB_00113959:
        if ((byte *)s == (byte *)0x0) {
          return (char *)0x0;
        }
        p = (char *)((byte *)p + 4);
      }
      else {
        if (9 < bVar1 - 0x30) goto LAB_001139c1;
        if (((bVar1 < 0x31) || (uVar4 = bVar1 - 0x31, ms->level <= (int)uVar4)) ||
           (ms->capture[uVar4].len == -1)) {
          uVar4 = luaL_error(ms->L,"invalid capture index");
        }
        uVar6 = ms->capture[(int)uVar4].len;
        if ((ulong)((long)ms->src_end - (long)s) < uVar6) {
          s = (char *)0x0;
        }
        else {
          iVar3 = bcmp(ms->capture[(int)uVar4].init,s,uVar6);
          s = (char *)((byte *)s + uVar6);
          if (iVar3 != 0) {
            s = (char *)0x0;
          }
        }
        if ((byte *)s == (byte *)0x0) {
          return (char *)0x0;
        }
        p = (char *)((byte *)p + 2);
      }
    }
    if (bVar1 < 0x28) {
      if (bVar1 == 0) {
        return (char *)(byte *)s;
      }
      if ((bVar1 == 0x24) && (((byte *)p)[1] == 0)) {
        if (s == ms->src_end) {
          return (char *)(byte *)s;
        }
        return (char *)0x0;
      }
    }
    else {
      if (bVar1 == 0x29) {
        uVar6 = (ulong)(uint)ms->level;
        ppVar7 = &ms->capture[uVar6 - 1].len;
        break;
      }
      if (bVar1 == 0x28) {
        if (((byte *)p)[1] == 0x29) {
          pbVar8 = (byte *)p + 2;
          iVar3 = -2;
        }
        else {
          pbVar8 = (byte *)p + 1;
          iVar3 = -1;
        }
        pcVar5 = start_capture(ms,s,(char *)pbVar8,iVar3);
        return pcVar5;
      }
    }
LAB_001139c1:
    pbVar8 = (byte *)classend(ms,p);
    if (s < ms->src_end) {
      iVar3 = singlematch((uint)(byte)*s,p,(char *)pbVar8);
      bVar9 = iVar3 != 0;
    }
    else {
      bVar9 = false;
    }
    bVar1 = *pbVar8;
    if (bVar1 < 0x2d) {
      if (bVar1 == 0x2a) {
        local_48 = max_expand(ms,s,p,(char *)pbVar8);
LAB_00113aaf:
        bVar9 = true;
      }
      else {
        if (bVar1 == 0x2b) {
          if (bVar9) {
            pcVar5 = max_expand(ms,(char *)((byte *)s + 1),p,(char *)pbVar8);
            goto LAB_00113ad0;
          }
        }
        else {
LAB_00113a91:
          if (bVar9) {
            s = (char *)((byte *)s + 1);
            goto LAB_00113ad9;
          }
        }
        bVar9 = true;
        local_48 = (char *)0x0;
      }
    }
    else {
      if (bVar1 != 0x3f) {
        if (bVar1 != 0x2d) goto LAB_00113a91;
        s_00 = (byte *)s;
        do {
          pcVar5 = match(ms,(char *)s_00,(char *)(pbVar8 + 1));
          if (pcVar5 == (char *)0x0) {
            if ((s_00 < ms->src_end) &&
               (iVar3 = singlematch((uint)*s_00,p,(char *)pbVar8), iVar3 != 0)) {
              s_00 = s_00 + 1;
              bVar9 = true;
            }
            else {
              local_48 = (char *)0x0;
              bVar9 = false;
            }
          }
          else {
            bVar9 = false;
            local_48 = pcVar5;
          }
        } while (bVar9);
        goto LAB_00113aaf;
      }
      if ((bVar9) &&
         (pcVar5 = match(ms,(char *)((byte *)s + 1),(char *)(pbVar8 + 1)), pcVar5 != (char *)0x0)) {
LAB_00113ad0:
        bVar9 = true;
        local_48 = pcVar5;
      }
      else {
        pbVar8 = pbVar8 + 1;
LAB_00113ad9:
        bVar9 = false;
        p = (char *)pbVar8;
      }
    }
    if (bVar9) {
      return local_48;
    }
  } while( true );
  while( true ) {
    uVar4 = (int)uVar6 - 1;
    uVar6 = (ulong)uVar4;
    lVar2 = *ppVar7;
    ppVar7 = ppVar7 + -2;
    if (lVar2 == -1) break;
    if ((int)uVar6 < 1) {
      uVar4 = luaL_error(ms->L,"invalid pattern capture");
      break;
    }
  }
  ms->capture[(int)uVar4].len = (long)s - (long)ms->capture[(int)uVar4].init;
  pcVar5 = match(ms,s,(char *)((byte *)p + 1));
  if (pcVar5 == (char *)0x0) {
    ms->capture[(int)uVar4].len = -1;
  }
  return pcVar5;
}

Assistant:

static const char *match (MatchState *ms, const char *s, const char *p) {
  init: /* using goto's to optimize tail recursion */
  switch (*p) {
    case '(': {  /* start capture */
      if (*(p+1) == ')')  /* position capture? */
        return start_capture(ms, s, p+2, CAP_POSITION);
      else
        return start_capture(ms, s, p+1, CAP_UNFINISHED);
    }
    case ')': {  /* end capture */
      return end_capture(ms, s, p+1);
    }
    case L_ESC: {
      switch (*(p+1)) {
        case 'b': {  /* balanced string? */
          s = matchbalance(ms, s, p+2);
          if (s == NULL) return NULL;
          p+=4; goto init;  /* else return match(ms, s, p+4); */
        }
        case 'f': {  /* frontier? */
          const char *ep; char previous;
          p += 2;
          if (*p != '[')
            luaL_error(ms->L, "missing " LUA_QL("[") " after "
                               LUA_QL("%%f") " in pattern");
          ep = classend(ms, p);  /* points to what is next */
          previous = (s == ms->src_init) ? '\0' : *(s-1);
          if (matchbracketclass(uchar(previous), p, ep-1) ||
             !matchbracketclass(uchar(*s), p, ep-1)) return NULL;
          p=ep; goto init;  /* else return match(ms, s, ep); */
        }
        default: {
          if (isdigit(uchar(*(p+1)))) {  /* capture results (%0-%9)? */
            s = match_capture(ms, s, uchar(*(p+1)));
            if (s == NULL) return NULL;
            p+=2; goto init;  /* else return match(ms, s, p+2) */
          }
          goto dflt;  /* case default */
        }
      }
    }
    case '\0': {  /* end of pattern */
      return s;  /* match succeeded */
    }
    case '$': {
      if (*(p+1) == '\0')  /* is the `$' the last char in pattern? */
        return (s == ms->src_end) ? s : NULL;  /* check end of string */
      else goto dflt;
    }
    default: dflt: {  /* it is a pattern item */
      const char *ep = classend(ms, p);  /* points to what is next */
      int m = s<ms->src_end && singlematch(uchar(*s), p, ep);
      switch (*ep) {
        case '?': {  /* optional */
          const char *res;
          if (m && ((res=match(ms, s+1, ep+1)) != NULL))
            return res;
          p=ep+1; goto init;  /* else return match(ms, s, ep+1); */
        }
        case '*': {  /* 0 or more repetitions */
          return max_expand(ms, s, p, ep);
        }
        case '+': {  /* 1 or more repetitions */
          return (m ? max_expand(ms, s+1, p, ep) : NULL);
        }
        case '-': {  /* 0 or more repetitions (minimum) */
          return min_expand(ms, s, p, ep);
        }
        default: {
          if (!m) return NULL;
          s++; p=ep; goto init;  /* else return match(ms, s+1, ep); */
        }
      }
    }
  }
}